

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PauliX.hpp
# Opt level: O2

int __thiscall qclab::qgates::PauliX<float>::toQASM(PauliX<float> *this,ostream *stream,int offset)

{
  uint qubit;
  __string_type local_30;
  
  qubit = offset + (this->super_QGate1<float>).qubit_;
  qasmX_abi_cxx11_(&local_30,(qclab *)(ulong)qubit,qubit);
  std::operator<<(stream,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return 0;
}

Assistant:

int toQASM( std::ostream& stream ,
                    const int offset = 0 ) const override {
          stream << qasmX( this->qubit_ + offset ) ;
          return 0 ;
        }